

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_container_index_equalorlarger(run_container_t *arr,uint16_t x)

{
  int iVar1;
  int32_t le;
  int32_t offset;
  int32_t index;
  uint16_t x_local;
  run_container_t *arr_local;
  
  arr_local._4_4_ = interleavedBinarySearch(arr->runs,arr->n_runs,x);
  if (arr_local._4_4_ < 0) {
    iVar1 = -arr_local._4_4_;
    arr_local._4_4_ = iVar1 + -2;
    if (((arr_local._4_4_ == -1) ||
        ((int)(uint)arr->runs[arr_local._4_4_].length <
         (int)((uint)x - (uint)arr->runs[arr_local._4_4_].value))) &&
       (arr_local._4_4_ = iVar1 + -1, arr->n_runs <= arr_local._4_4_)) {
      arr_local._4_4_ = -1;
    }
  }
  return arr_local._4_4_;
}

Assistant:

inline int run_container_index_equalorlarger(const run_container_t *arr, uint16_t x) {
    int32_t index = interleavedBinarySearch(arr->runs, arr->n_runs, x);
    if (index >= 0) return index;
    index = -index - 2;  // points to preceding run, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = x - arr->runs[index].value;
        int32_t le = arr->runs[index].length;
        if (offset <= le) return index;
    }
    index += 1;
    if(index  < arr->n_runs) {
      return index;
    }
    return -1;
}